

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject_existing_object(Group *this,View *view)

{
  View *this_00;
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  value_type pOVar3;
  uint64_t uVar4;
  Atom *pAVar5;
  Atom *this_01;
  float fVar6;
  float fVar7;
  double dVar8;
  pair<std::__detail::_Node_iterator<r_code::View_*,_true,_true>,_bool> pVar9;
  byte local_131;
  P<r_exec::View> local_80;
  undefined1 local_75;
  byte local_74;
  byte local_73;
  undefined1 local_72;
  byte local_71;
  bool group_is_c_salient;
  bool group_is_c_active;
  bool reduce_view;
  bool wiew_was_salient;
  value_type pOStack_70;
  bool wiew_is_salient;
  value_type local_68 [3];
  value_type local_50;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> guard;
  Code *local_30;
  View *local_28;
  View *existing_view;
  Code *object;
  View *view_local;
  Group *this_local;
  
  object = (Code *)view;
  view_local = (View *)this;
  existing_view = (View *)core::P::operator_cast_to_Code_((P *)&(view->super_View).object);
  (*(existing_view->super_View).super__Object._vptr__Object[0x11])();
  iVar2 = (*(existing_view->super_View).super__Object._vptr__Object[0x18])(existing_view,this,0);
  local_28 = (View *)CONCAT44(extraout_var,iVar2);
  if (local_28 == (View *)0x0) {
    local_30 = object;
    pVar9 = std::
            unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
            ::insert((unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
                      *)&(existing_view->super_View).field_0x58,(value_type *)&local_30);
    guard._M_device =
         (mutex_type *)pVar9.first.super__Node_iterator_base<r_code::View_*,_true>._M_cur;
    (*(existing_view->super_View).super__Object._vptr__Object[0x12])();
    inject(this,(View *)object);
  }
  else {
    (*(existing_view->super_View).super__Object._vptr__Object[0x12])();
    std::lock_guard<std::mutex>::lock_guard(&local_48,&this->mutex);
    pOVar3 = (value_type)operator_new(0x20);
    uVar4 = View::get_oid(local_28);
    fVar6 = View::get_res((View *)object);
    Set::Set((Set *)pOVar3,uVar4,4,(double)fVar6);
    local_50 = pOVar3;
    std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::push_back
              (&this->pending_operations,&local_50);
    pOVar3 = (value_type)operator_new(0x20);
    uVar4 = View::get_oid(local_28);
    fVar6 = View::get_sln((View *)object);
    Set::Set((Set *)pOVar3,uVar4,3,(double)fVar6);
    local_68[0] = pOVar3;
    std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::push_back
              (&this->pending_operations,local_68);
    (*(existing_view->super_View).super__Object._vptr__Object[4])(existing_view,0);
    bVar1 = r_code::Atom::getDescriptor();
    if (bVar1 - 0xc9 < 6) {
      pOVar3 = (value_type)operator_new(0x20);
      uVar4 = View::get_oid(local_28);
      fVar6 = View::get_act((View *)object);
      Set::Set((Set *)pOVar3,uVar4,7,(double)fVar6);
      pOStack_70 = pOVar3;
      std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::
      push_back(&this->pending_operations,&stack0xffffffffffffff90);
    }
    pAVar5 = r_code::View::code((View *)object,1);
    this_01 = r_code::View::code(&local_28->super_View,1);
    r_code::Atom::operator=(this_01,pAVar5);
    this_00 = local_28;
    uVar4 = (*Now)();
    r_code::View::set_ijt(&this_00->super_View,uVar4);
    fVar6 = View::get_sln((View *)object);
    fVar7 = get_sln_thr(this);
    local_71 = fVar7 < fVar6;
    fVar6 = View::get_sln(local_28);
    fVar7 = get_sln_thr(this);
    local_72 = fVar7 < fVar6;
    local_131 = 0;
    if (!(bool)local_72) {
      local_131 = local_71;
    }
    local_73 = local_131 & 1;
    dVar8 = update_c_act(this);
    fVar6 = get_c_act_thr(this);
    local_74 = (double)fVar6 < dVar8;
    dVar8 = update_c_sln(this);
    fVar6 = get_c_sln_thr(this);
    local_75 = (double)fVar6 < dVar8;
    if ((((local_74 & 1) != 0) && ((bool)local_75)) && ((local_73 & 1) != 0)) {
      core::P<r_exec::View>::P(&local_80,(View *)object);
      std::
      multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>::
      insert(&this->newly_salient_views,&local_80);
      core::P<r_exec::View>::~P(&local_80);
      inject_reduction_jobs(this,(View *)object);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_48);
  }
  return;
}

Assistant:

void Group::inject_existing_object(View *view)   // the view can hold anything but groups and notifications.
{
    Code *object = view->object;
    object->acq_views();
    View *existing_view = (View *)object->get_view(this, false);

    if (!existing_view) { // no existing view: add the view to the object's view_map and inject.
        object->views.insert(view);
        object->rel_views();
        inject(view);
    } else { // call set on the ctrl values of the existing view with the new view's ctrl values, including sync. NB: org left unchanged.
        object->rel_views();
        std::lock_guard<std::mutex> guard(mutex);
        pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_RES, view->get_res()));
        pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_SLN, view->get_sln()));

        switch (object->code(0).getDescriptor()) {
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_ACT, view->get_act()));
            break;
        }

        existing_view->code(VIEW_SYNC) = view->code(VIEW_SYNC);
        existing_view->set_ijt(Now());
        bool wiew_is_salient = view->get_sln() > get_sln_thr();
        bool wiew_was_salient = existing_view->get_sln() > get_sln_thr();
        bool reduce_view = (!wiew_was_salient && wiew_is_salient);
        // give a chance to ipgms to reduce the new view.
        bool group_is_c_active = update_c_act() > get_c_act_thr();
        bool group_is_c_salient = update_c_sln() > get_c_sln_thr();

        if (group_is_c_active && group_is_c_salient && reduce_view) {
            newly_salient_views.insert(view);
            inject_reduction_jobs(view);
        }
    }
}